

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

bool __thiscall
vectorgraphics::TikzPlotter::compileTexFile(TikzPlotter *this,path *path,string *name)

{
  int iVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  char *__command;
  string local_1f8 [36];
  int local_1d4;
  undefined1 local_1d0 [4];
  int ret;
  ostringstream local_1a0 [8];
  ostringstream oss;
  string *name_local;
  path *path_local;
  TikzPlotter *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"cd ");
  pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,path);
  poVar2 = std::operator<<(pbVar3," && lualatex --halt-on-error ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,name
                 ,".tex");
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  std::operator<<(poVar2,">/dev/null");
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  iVar1 = system(__command);
  std::__cxx11::string::~string(local_1f8);
  local_1d4 = iVar1;
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Error in compileTexFile: lualatex call not succesful");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return iVar1 == 0;
}

Assistant:

bool TikzPlotter::compileTexFile(std::filesystem::path path, std::string name) const {
    std::ostringstream oss;
    oss << "cd " << path << " && lualatex --halt-on-error " << (name + ".tex") << ">/dev/null";
    auto ret = std::system(oss.str().c_str());
    if (ret != 0) {
      std::cout << "Error in compileTexFile: lualatex call not succesful" << std::endl;
      return false;
    }
    return true;
  }